

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_free.c
# Opt level: O3

void lyd_free_tree(lyd_node *node)

{
  lysc_node *plVar1;
  
  if (node == (lyd_node *)0x0) {
    return;
  }
  plVar1 = node->schema;
  if ((((plVar1 != (lysc_node *)0x0) && (plVar1->nodetype == 4)) && ((plVar1->flags & 0x100) != 0))
     && (node->parent != (lyd_node_inner *)0x0)) {
    ly_log(plVar1->module->ctx,LY_LLERR,LY_EINVAL,
           "Cannot free a list key \"%s\", free the list instance instead.",plVar1->name);
    return;
  }
  lyd_unlink(node);
  lyd_free_subtree(node);
  return;
}

Assistant:

LIBYANG_API_DEF void
lyd_free_tree(struct lyd_node *node)
{
    if (!node) {
        return;
    }

    if (lysc_is_key(node->schema) && node->parent) {
        LOGERR(LYD_CTX(node), LY_EINVAL, "Cannot free a list key \"%s\", free the list instance instead.", LYD_NAME(node));
        return;
    }

    lyd_unlink(node);
    lyd_free_subtree(node);
}